

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O2

int uv_tty_set_mode(uv_tty_t *tty,uv_tty_mode_t mode)

{
  termios *__termios_p;
  undefined8 uVar1;
  int iVar2;
  uv_spinlock_t uVar3;
  int iVar4;
  int *piVar5;
  termios local_68;
  
  if (tty->mode == mode) {
    return 0;
  }
  iVar4 = (tty->io_watcher).fd;
  if (mode != UV_TTY_MODE_NORMAL && tty->mode == UV_TTY_MODE_NORMAL) {
    __termios_p = &tty->orig_termios;
    iVar2 = tcgetattr(iVar4,(termios *)__termios_p);
    if (iVar2 != 0) goto LAB_004f4c5d;
    do {
      LOCK();
      uVar3.lock = termios_spinlock.lock;
      if (termios_spinlock.lock == 0) {
        termios_spinlock.lock = 1;
        uVar3.lock = 0;
      }
      UNLOCK();
    } while (uVar3.lock != 0);
    if (orig_termios_fd == -1) {
      orig_termios.c_iflag = __termios_p->c_iflag;
      orig_termios.c_oflag = __termios_p->c_oflag;
      orig_termios.c_cflag = (tty->orig_termios).c_cflag;
      orig_termios.c_lflag = (tty->orig_termios).c_lflag;
      orig_termios.c_line = (tty->orig_termios).c_line;
      orig_termios.c_cc[0] = (tty->orig_termios).c_cc[0];
      orig_termios.c_cc[1] = (tty->orig_termios).c_cc[1];
      orig_termios.c_cc[2] = (tty->orig_termios).c_cc[2];
      orig_termios.c_cc[3] = (tty->orig_termios).c_cc[3];
      orig_termios.c_cc[4] = (tty->orig_termios).c_cc[4];
      orig_termios.c_cc[5] = (tty->orig_termios).c_cc[5];
      orig_termios.c_cc[6] = (tty->orig_termios).c_cc[6];
      orig_termios.c_cc._7_8_ = *(undefined8 *)((tty->orig_termios).c_cc + 7);
      orig_termios.c_cc._15_8_ = *(undefined8 *)((tty->orig_termios).c_cc + 0xf);
      uVar1 = *(undefined8 *)((tty->orig_termios).c_cc + 0x17);
      orig_termios.c_ispeed = (tty->orig_termios).c_ispeed;
      orig_termios.c_ospeed = (tty->orig_termios).c_ospeed;
      orig_termios._48_4_ = SUB84((ulong)*(undefined8 *)((tty->orig_termios).c_cc + 0x1b) >> 0x20,0)
      ;
      orig_termios.c_cc._23_4_ = SUB84(uVar1,0);
      orig_termios.c_cc._27_4_ = SUB84((ulong)uVar1 >> 0x20,0);
      orig_termios_fd = iVar4;
    }
    termios_spinlock.lock = 0;
  }
  local_68.c_iflag = (tty->orig_termios).c_iflag;
  local_68.c_oflag = (tty->orig_termios).c_oflag;
  local_68.c_cflag = (tty->orig_termios).c_cflag;
  local_68.c_lflag = (tty->orig_termios).c_lflag;
  local_68.c_line = (tty->orig_termios).c_line;
  local_68.c_cc[0] = (tty->orig_termios).c_cc[0];
  local_68.c_cc[1] = (tty->orig_termios).c_cc[1];
  local_68.c_cc[2] = (tty->orig_termios).c_cc[2];
  local_68.c_cc[3] = (tty->orig_termios).c_cc[3];
  local_68.c_cc[4] = (tty->orig_termios).c_cc[4];
  local_68.c_cc[5] = (tty->orig_termios).c_cc[5];
  local_68.c_cc[6] = (tty->orig_termios).c_cc[6];
  local_68.c_cc._7_8_ = *(undefined8 *)((tty->orig_termios).c_cc + 7);
  local_68.c_cc._15_8_ = *(undefined8 *)((tty->orig_termios).c_cc + 0xf);
  uVar1 = *(undefined8 *)((tty->orig_termios).c_cc + 0x17);
  local_68.c_ispeed = (tty->orig_termios).c_ispeed;
  local_68.c_ospeed = (tty->orig_termios).c_ospeed;
  local_68._48_4_ = SUB84((ulong)*(undefined8 *)((tty->orig_termios).c_cc + 0x1b) >> 0x20,0);
  local_68.c_cc._23_4_ = SUB84(uVar1,0);
  local_68.c_cc._27_4_ = SUB84((ulong)uVar1 >> 0x20,0);
  if (mode == UV_TTY_MODE_IO) {
    cfmakeraw(&local_68);
  }
  else if (mode == UV_TTY_MODE_RAW) {
    local_68._0_8_ = local_68._0_8_ & 0xfffffffffffffacd | 0x400000000;
    local_68._8_8_ = local_68._8_8_ & 0xffff7ff4ffffffff | 0x30;
    local_68.c_cc._5_2_ = 0x100;
  }
  iVar4 = tcsetattr(iVar4,1,&local_68);
  if (iVar4 == 0) {
    tty->mode = mode;
    return 0;
  }
LAB_004f4c5d:
  piVar5 = __errno_location();
  return -*piVar5;
}

Assistant:

int uv_tty_set_mode(uv_tty_t* tty, uv_tty_mode_t mode) {
  struct termios tmp;
  int fd;

  if (tty->mode == (int) mode)
    return 0;

  fd = uv__stream_fd(tty);
  if (tty->mode == UV_TTY_MODE_NORMAL && mode != UV_TTY_MODE_NORMAL) {
    if (tcgetattr(fd, &tty->orig_termios))
      return -errno;

    /* This is used for uv_tty_reset_mode() */
    uv_spinlock_lock(&termios_spinlock);
    if (orig_termios_fd == -1) {
      orig_termios = tty->orig_termios;
      orig_termios_fd = fd;
    }
    uv_spinlock_unlock(&termios_spinlock);
  }

  tmp = tty->orig_termios;
  switch (mode) {
    case UV_TTY_MODE_NORMAL:
      break;
    case UV_TTY_MODE_RAW:
      tmp.c_iflag &= ~(BRKINT | ICRNL | INPCK | ISTRIP | IXON);
      tmp.c_oflag |= (ONLCR);
      tmp.c_cflag |= (CS8);
      tmp.c_lflag &= ~(ECHO | ICANON | IEXTEN | ISIG);
      tmp.c_cc[VMIN] = 1;
      tmp.c_cc[VTIME] = 0;
      break;
    case UV_TTY_MODE_IO:
      uv__tty_make_raw(&tmp);
      break;
  }

  /* Apply changes after draining */
  if (tcsetattr(fd, TCSADRAIN, &tmp))
    return -errno;

  tty->mode = mode;
  return 0;
}